

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

string * __thiscall kws::Parser::GetLastWarnings_abi_cxx11_(Parser *this)

{
  bool bVar1;
  char *__s;
  reference pWVar2;
  string *in_RDI;
  char *val;
  size_t length;
  const_iterator it;
  string *output;
  vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_> *in_stack_ffffffffffffff58;
  vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_> *in_stack_ffffffffffffff60;
  vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_> *this_00;
  __normal_iterator<const_kws::WarningStruct_*,_std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>_>
  local_30 [3];
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>::begin
            (in_stack_ffffffffffffff58);
  __gnu_cxx::
  __normal_iterator<kws::WarningStruct_const*,std::vector<kws::WarningStruct,std::allocator<kws::WarningStruct>>>
  ::__normal_iterator<kws::WarningStruct*>
            ((__normal_iterator<const_kws::WarningStruct_*,_std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>_>
              *)in_stack_ffffffffffffff60,
             (__normal_iterator<kws::WarningStruct_*,_std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>_>
              *)in_stack_ffffffffffffff58);
  while( true ) {
    std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>::end
              (in_stack_ffffffffffffff58);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_kws::WarningStruct_*,_std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<kws::WarningStruct_*,_std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)in_RDI,"Warning #");
    __s = (char *)operator_new__(10);
    pWVar2 = __gnu_cxx::
             __normal_iterator<const_kws::WarningStruct_*,_std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>_>
             ::operator*(local_30);
    snprintf(__s,10,"%ld",pWVar2->number);
    std::__cxx11::string::operator+=((string *)in_RDI,__s);
    if (__s != (char *)0x0) {
      operator_delete__(__s);
    }
    std::__cxx11::string::operator+=((string *)in_RDI," (");
    in_stack_ffffffffffffff58 =
         (vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_> *)operator_new__(10);
    in_stack_ffffffffffffff60 = in_stack_ffffffffffffff58;
    this_00 = in_stack_ffffffffffffff58;
    pWVar2 = __gnu_cxx::
             __normal_iterator<const_kws::WarningStruct_*,_std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>_>
             ::operator*(local_30);
    snprintf((char *)in_stack_ffffffffffffff60,10,"%ld",pWVar2->line);
    std::__cxx11::string::operator+=((string *)in_RDI,(char *)in_stack_ffffffffffffff58);
    if (in_stack_ffffffffffffff58 !=
        (vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_> *)0x0) {
      operator_delete__(in_stack_ffffffffffffff58);
    }
    std::__cxx11::string::operator+=((string *)in_RDI,") ");
    pWVar2 = __gnu_cxx::
             __normal_iterator<const_kws::WarningStruct_*,_std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>_>
             ::operator*(local_30);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&pWVar2->description);
    std::__cxx11::string::operator+=((string *)in_RDI,"\n");
    __gnu_cxx::
    __normal_iterator<const_kws::WarningStruct_*,_std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>_>
    ::operator++((__normal_iterator<const_kws::WarningStruct_*,_std::vector<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>_>
                  *)this_00,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  }
  return in_RDI;
}

Assistant:

std::string Parser::GetLastWarnings()
{
  std::string output = "";
  std::vector<Warning>::const_iterator it = m_WarningList.begin();
  while(it != m_WarningList.end())
    {
    output += "Warning #";
    constexpr size_t length = 10;
    char* val = new char[length];
    snprintf(val,length,"%ld",(*it).number);
    output += val;
    delete [] val;
    output += " (";
    val = new char[length];
    snprintf(val,length,"%ld",(*it).line);
    output += val;
    delete [] val;
    output += ") ";
    output += (*it).description;
    output += "\n";
    it++;
    }
  return output;
}